

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O3

gboolean g_hash_table_remove(GHashTable *hash_table,gconstpointer key)

{
  guint gVar1;
  gboolean gVar2;
  GHashNode *pGVar3;
  GHashNode *pGVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  if (hash_table == (GHashTable *)0x0) {
    gVar2 = 0;
  }
  else {
    gVar1 = (*hash_table->hash_func)(key);
    uVar5 = 2;
    if (2 < gVar1) {
      uVar5 = (ulong)gVar1;
    }
    uVar7 = uVar5 % (ulong)(uint)hash_table->mod;
    pGVar4 = hash_table->nodes;
    gVar1 = pGVar4[uVar7].key_hash;
    gVar2 = 0;
    if (gVar1 != 0) {
      pGVar3 = pGVar4 + uVar7;
      iVar6 = 1;
      do {
        if (gVar1 == (guint)uVar5) {
          if (hash_table->key_equal_func == (GEqualFunc)0x0) {
            if (pGVar3->key == key) break;
          }
          else {
            gVar2 = (*hash_table->key_equal_func)(pGVar3->key,key);
            pGVar4 = hash_table->nodes;
            if (gVar2 != 0) break;
          }
        }
        uVar7 = (ulong)((int)uVar7 + iVar6 & hash_table->mask);
        pGVar3 = pGVar4 + uVar7;
        gVar1 = pGVar3->key_hash;
        iVar6 = iVar6 + 1;
      } while (gVar1 != 0);
      gVar2 = 0;
      if (pGVar4[uVar7].key_hash != 0) {
        pGVar4 = pGVar4 + uVar7;
        if (hash_table->key_destroy_func != (GDestroyNotify)0x0) {
          (*hash_table->key_destroy_func)(pGVar4->key);
        }
        if (hash_table->value_destroy_func != (GDestroyNotify)0x0) {
          (*hash_table->value_destroy_func)(pGVar4->value);
        }
        pGVar4->key_hash = 1;
        pGVar4->key = (gpointer)0x0;
        pGVar4->value = (gpointer)0x0;
        hash_table->nnodes = hash_table->nnodes + -1;
        g_hash_table_maybe_resize(hash_table);
        gVar2 = 1;
      }
    }
  }
  return gVar2;
}

Assistant:

static gboolean g_hash_table_remove_internal (GHashTable *hash_table,
        gconstpointer  key,
        gboolean       notify)
{
    GHashNode *node;
    guint node_index;

    if (hash_table == NULL) return FALSE;

    node_index = g_hash_table_lookup_node (hash_table, key);
    node = &hash_table->nodes [node_index];

    /* g_hash_table_lookup_node() never returns a tombstone, so this is safe */
    if (!node->key_hash)
        return FALSE;

    g_hash_table_remove_node (hash_table, node, notify);
    g_hash_table_maybe_resize (hash_table);

    return TRUE;
}